

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-validator.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_36822::logical_combination<((anonymous_namespace)::logical_combination_types)0>::
validate(logical_combination<((anonymous_namespace)::logical_combination_types)0> *this,
        json_pointer *ptr,json *instance,json_patch *patch,error_handler *e)

{
  pointer peVar1;
  pointer *ppeVar2;
  value_t vVar3;
  array_t *paVar4;
  element_type *peVar5;
  char cVar6;
  pointer psVar7;
  vector<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  *this_00;
  long *plVar8;
  undefined8 *puVar9;
  long *plVar10;
  size_type *psVar11;
  undefined8 *puVar12;
  ulong uVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  char cVar15;
  undefined8 uVar16;
  pointer peVar17;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar18;
  pointer peVar19;
  size_t __new_size;
  ulong uVar20;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar21;
  bool bVar22;
  bool bVar23;
  logical_combination_error_handler esub;
  string __str;
  logical_combination_error_handler error_summary;
  string local_100;
  ulong local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  logical_combination_error_handler local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  error_handler *local_78;
  long local_70;
  logical_combination<((anonymous_namespace)::logical_combination_types)0> *local_68;
  json_pointer *local_60;
  json *local_58;
  logical_combination_error_handler local_50;
  
  local_50.super_error_handler._vptr_error_handler =
       (_func_int **)&PTR__logical_combination_error_handler_001567b8;
  local_50.error_entry_list_.
  super__Vector_base<(anonymous_namespace)::logical_combination_error_handler::error_entry,_std::allocator<(anonymous_namespace)::logical_combination_error_handler::error_entry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_50.error_entry_list_.
  super__Vector_base<(anonymous_namespace)::logical_combination_error_handler::error_entry,_std::allocator<(anonymous_namespace)::logical_combination_error_handler::error_entry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_50.error_entry_list_.
  super__Vector_base<(anonymous_namespace)::logical_combination_error_handler::error_entry,_std::allocator<(anonymous_namespace)::logical_combination_error_handler::error_entry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  psVar7 = (this->subschemata_).
           super__Vector_base<std::shared_ptr<(anonymous_namespace)::schema>,_std::allocator<std::shared_ptr<(anonymous_namespace)::schema>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  bVar23 = (this->subschemata_).
           super__Vector_base<std::shared_ptr<(anonymous_namespace)::schema>,_std::allocator<std::shared_ptr<(anonymous_namespace)::schema>_>_>
           ._M_impl.super__Vector_impl_data._M_finish == psVar7;
  local_78 = e;
  local_68 = this;
  local_60 = ptr;
  local_58 = instance;
  if (bVar23) {
    bVar22 = true;
  }
  else {
    local_70 = 0;
    local_e0 = 0;
    do {
      paVar21 = &local_d8.field_2;
      paVar14 = &local_100.field_2;
      paVar18 = &local_98.field_2;
      local_b8.super_error_handler._vptr_error_handler =
           (_func_int **)&PTR__logical_combination_error_handler_001567b8;
      local_b8.error_entry_list_.
      super__Vector_base<(anonymous_namespace)::logical_combination_error_handler::error_entry,_std::allocator<(anonymous_namespace)::logical_combination_error_handler::error_entry>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_b8.error_entry_list_.
      super__Vector_base<(anonymous_namespace)::logical_combination_error_handler::error_entry,_std::allocator<(anonymous_namespace)::logical_combination_error_handler::error_entry>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_b8.error_entry_list_.
      super__Vector_base<(anonymous_namespace)::logical_combination_error_handler::error_entry,_std::allocator<(anonymous_namespace)::logical_combination_error_handler::error_entry>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      vVar3 = (patch->j_).m_type;
      __new_size = (size_t)vVar3;
      if (vVar3 != null) {
        if (vVar3 == object) {
          __new_size = (((patch->j_).m_value.object)->_M_t)._M_impl.super__Rb_tree_header.
                       _M_node_count;
        }
        else if (vVar3 == array) {
          paVar4 = (patch->j_).m_value.array;
          __new_size = (long)(paVar4->
                             super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish -
                       (long)(paVar4->
                             super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start >> 4;
        }
        else {
          __new_size = 1;
        }
      }
      peVar5 = psVar7[local_e0].
               super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      (*peVar5->_vptr_schema[3])(peVar5,local_60,local_58,patch,&local_b8);
      if (local_b8.error_entry_list_.
          super__Vector_base<(anonymous_namespace)::logical_combination_error_handler::error_entry,_std::allocator<(anonymous_namespace)::logical_combination_error_handler::error_entry>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          local_b8.error_entry_list_.
          super__Vector_base<(anonymous_namespace)::logical_combination_error_handler::error_entry,_std::allocator<(anonymous_namespace)::logical_combination_error_handler::error_entry>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        local_70 = local_70 + 1;
      }
      else {
        this_00 = nlohmann::json_abi_v3_11_2::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ::
                  get_ref_impl<std::vector<nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>&,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                            (&patch->j_);
        std::
        vector<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
        ::resize(this_00,__new_size);
        cVar15 = '\x01';
        if (9 < local_e0) {
          uVar20 = local_e0;
          cVar6 = '\x04';
          do {
            cVar15 = cVar6;
            if (uVar20 < 100) {
              cVar15 = cVar15 + -2;
              goto LAB_00120011;
            }
            if (uVar20 < 1000) {
              cVar15 = cVar15 + -1;
              goto LAB_00120011;
            }
            if (uVar20 < 10000) goto LAB_00120011;
            bVar22 = 99999 < uVar20;
            uVar20 = uVar20 / 10000;
            cVar6 = cVar15 + '\x04';
          } while (bVar22);
          cVar15 = cVar15 + '\x01';
        }
LAB_00120011:
        local_98._M_dataplus._M_p = (pointer)paVar18;
        std::__cxx11::string::_M_construct((ulong)&local_98,cVar15);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  (local_98._M_dataplus._M_p,(uint)local_98._M_string_length,local_e0);
        plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,0x141874);
        plVar10 = plVar8 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)plVar10) {
          local_d8.field_2._M_allocated_capacity = *plVar10;
          local_d8.field_2._8_8_ = plVar8[3];
          local_d8._M_dataplus._M_p = (pointer)paVar21;
        }
        else {
          local_d8.field_2._M_allocated_capacity = *plVar10;
          local_d8._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_d8._M_string_length = plVar8[1];
        *plVar8 = (long)plVar10;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_d8);
        psVar11 = (size_type *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_100.field_2._M_allocated_capacity = *psVar11;
          local_100.field_2._8_8_ = plVar8[3];
          local_100._M_dataplus._M_p = (pointer)paVar14;
        }
        else {
          local_100.field_2._M_allocated_capacity = *psVar11;
          local_100._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_100._M_string_length = plVar8[1];
        *plVar8 = (long)psVar11;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        logical_combination_error_handler::propagate
                  (&local_b8,&local_50.super_error_handler,&local_100);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._M_dataplus._M_p != paVar14) {
          operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != paVar21) {
          operator_delete(local_d8._M_dataplus._M_p,
                          (ulong)(local_d8.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != paVar18) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
      }
      peVar1 = local_b8.error_entry_list_.
               super__Vector_base<(anonymous_namespace)::logical_combination_error_handler::error_entry,_std::allocator<(anonymous_namespace)::logical_combination_error_handler::error_entry>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (local_b8.error_entry_list_.
          super__Vector_base<(anonymous_namespace)::logical_combination_error_handler::error_entry,_std::allocator<(anonymous_namespace)::logical_combination_error_handler::error_entry>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_b8.error_entry_list_.
          super__Vector_base<(anonymous_namespace)::logical_combination_error_handler::error_entry,_std::allocator<(anonymous_namespace)::logical_combination_error_handler::error_entry>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        std::operator+(&local_100,
                       "at least one subschema has failed, but all of them are required to validate - "
                       ,&(local_b8.error_entry_list_.
                          super__Vector_base<(anonymous_namespace)::logical_combination_error_handler::error_entry,_std::allocator<(anonymous_namespace)::logical_combination_error_handler::error_entry>_>
                          ._M_impl.super__Vector_impl_data._M_start)->message_);
        (*local_78->_vptr_error_handler[2])(local_78,peVar1,&peVar1->instance_,&local_100);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._M_dataplus._M_p != paVar14) {
          operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
        }
        cVar15 = '\x01';
        if (9 < local_e0) {
          uVar20 = local_e0;
          cVar6 = '\x04';
          do {
            cVar15 = cVar6;
            if (uVar20 < 100) {
              cVar15 = cVar15 + -2;
              goto LAB_001201fb;
            }
            if (uVar20 < 1000) {
              cVar15 = cVar15 + -1;
              goto LAB_001201fb;
            }
            if (uVar20 < 10000) goto LAB_001201fb;
            bVar22 = 99999 < uVar20;
            uVar20 = uVar20 / 10000;
            cVar6 = cVar15 + '\x04';
          } while (bVar22);
          cVar15 = cVar15 + '\x01';
        }
LAB_001201fb:
        local_98._M_dataplus._M_p = (pointer)paVar18;
        std::__cxx11::string::_M_construct((ulong)&local_98,cVar15);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  (local_98._M_dataplus._M_p,(uint)local_98._M_string_length,local_e0);
        plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,0x14185e);
        plVar10 = plVar8 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)plVar10) {
          local_d8.field_2._M_allocated_capacity = *plVar10;
          local_d8.field_2._8_8_ = plVar8[3];
          local_d8._M_dataplus._M_p = (pointer)paVar21;
        }
        else {
          local_d8.field_2._M_allocated_capacity = *plVar10;
          local_d8._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_d8._M_string_length = plVar8[1];
        *plVar8 = (long)plVar10;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_d8);
        psVar11 = (size_type *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_100.field_2._M_allocated_capacity = *psVar11;
          local_100.field_2._8_8_ = plVar8[3];
          local_100._M_dataplus._M_p = (pointer)paVar14;
        }
        else {
          local_100.field_2._M_allocated_capacity = *psVar11;
          local_100._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_100._M_string_length = plVar8[1];
        *plVar8 = (long)psVar11;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        logical_combination_error_handler::propagate(&local_b8,local_78,&local_100);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._M_dataplus._M_p != paVar14) {
          operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != paVar21) {
          operator_delete(local_d8._M_dataplus._M_p,
                          (ulong)(local_d8.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != paVar18) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
      }
      peVar17 = local_b8.error_entry_list_.
                super__Vector_base<(anonymous_namespace)::logical_combination_error_handler::error_entry,_std::allocator<(anonymous_namespace)::logical_combination_error_handler::error_entry>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      peVar1 = local_b8.error_entry_list_.
               super__Vector_base<(anonymous_namespace)::logical_combination_error_handler::error_entry,_std::allocator<(anonymous_namespace)::logical_combination_error_handler::error_entry>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_b8.super_error_handler._vptr_error_handler =
           (_func_int **)&PTR__logical_combination_error_handler_001567b8;
      if (local_b8.error_entry_list_.
          super__Vector_base<(anonymous_namespace)::logical_combination_error_handler::error_entry,_std::allocator<(anonymous_namespace)::logical_combination_error_handler::error_entry>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_b8.error_entry_list_.
          super__Vector_base<(anonymous_namespace)::logical_combination_error_handler::error_entry,_std::allocator<(anonymous_namespace)::logical_combination_error_handler::error_entry>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        paVar18 = &((local_b8.error_entry_list_.
                     super__Vector_base<(anonymous_namespace)::logical_combination_error_handler::error_entry,_std::allocator<(anonymous_namespace)::logical_combination_error_handler::error_entry>_>
                     ._M_impl.super__Vector_impl_data._M_start)->message_).field_2;
        do {
          plVar8 = (long *)(((string *)(paVar18 + -1))->_M_dataplus)._M_p;
          if (paVar18 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)plVar8) {
            operator_delete(plVar8,paVar18->_M_allocated_capacity + 1);
          }
          nlohmann::json_abi_v3_11_2::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         *)(paVar18 + -2));
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)paVar18 + -0x38));
          peVar19 = (pointer)(paVar18 + 1);
          paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)((long)paVar18 + 0x48);
        } while (peVar19 != peVar17);
      }
      if (local_b8.error_entry_list_.
          super__Vector_base<(anonymous_namespace)::logical_combination_error_handler::error_entry,_std::allocator<(anonymous_namespace)::logical_combination_error_handler::error_entry>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_b8.error_entry_list_.
                        super__Vector_base<(anonymous_namespace)::logical_combination_error_handler::error_entry,_std::allocator<(anonymous_namespace)::logical_combination_error_handler::error_entry>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_b8.error_entry_list_.
                              super__Vector_base<(anonymous_namespace)::logical_combination_error_handler::error_entry,_std::allocator<(anonymous_namespace)::logical_combination_error_handler::error_entry>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_b8.error_entry_list_.
                              super__Vector_base<(anonymous_namespace)::logical_combination_error_handler::error_entry,_std::allocator<(anonymous_namespace)::logical_combination_error_handler::error_entry>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (peVar1 != peVar17) break;
      local_e0 = local_e0 + 1;
      psVar7 = (local_68->subschemata_).
               super__Vector_base<std::shared_ptr<(anonymous_namespace)::schema>,_std::allocator<std::shared_ptr<(anonymous_namespace)::schema>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      bVar22 = local_e0 <
               (ulong)((long)(local_68->subschemata_).
                             super__Vector_base<std::shared_ptr<(anonymous_namespace)::schema>,_std::allocator<std::shared_ptr<(anonymous_namespace)::schema>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)psVar7 >> 4);
      bVar23 = !bVar22;
    } while (bVar22);
    bVar22 = local_70 == 0;
  }
  if (!(bool)(bVar23 & bVar22)) goto LAB_001206f1;
  std::operator+(&local_98,
                 "no subschema has succeeded, but one of them is required to validate. Type: ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &(anonymous_namespace)::
                  logical_combination<((anonymous_namespace)::logical_combination_types)0>::
                  key_abi_cxx11_);
  puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_98);
  paVar18 = &local_d8.field_2;
  puVar12 = puVar9 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar12) {
    local_d8.field_2._M_allocated_capacity = *puVar12;
    local_d8.field_2._8_8_ = puVar9[3];
    local_d8._M_dataplus._M_p = (pointer)paVar18;
  }
  else {
    local_d8.field_2._M_allocated_capacity = *puVar12;
    local_d8._M_dataplus._M_p = (pointer)*puVar9;
  }
  local_d8._M_string_length = puVar9[1];
  *puVar9 = puVar12;
  puVar9[1] = 0;
  *(undefined1 *)(puVar9 + 2) = 0;
  uVar20 = (long)(local_68->subschemata_).
                 super__Vector_base<std::shared_ptr<(anonymous_namespace)::schema>,_std::allocator<std::shared_ptr<(anonymous_namespace)::schema>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(local_68->subschemata_).
                 super__Vector_base<std::shared_ptr<(anonymous_namespace)::schema>,_std::allocator<std::shared_ptr<(anonymous_namespace)::schema>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 4;
  cVar15 = '\x01';
  if (9 < uVar20) {
    uVar13 = uVar20;
    cVar6 = '\x04';
    do {
      cVar15 = cVar6;
      if (uVar13 < 100) {
        cVar15 = cVar15 + -2;
        goto LAB_001204e5;
      }
      if (uVar13 < 1000) {
        cVar15 = cVar15 + -1;
        goto LAB_001204e5;
      }
      if (uVar13 < 10000) goto LAB_001204e5;
      bVar23 = 99999 < uVar13;
      uVar13 = uVar13 / 10000;
      cVar6 = cVar15 + '\x04';
    } while (bVar23);
    cVar15 = cVar15 + '\x01';
  }
LAB_001204e5:
  ppeVar2 = &local_b8.error_entry_list_.
             super__Vector_base<(anonymous_namespace)::logical_combination_error_handler::error_entry,_std::allocator<(anonymous_namespace)::logical_combination_error_handler::error_entry>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  local_b8.super_error_handler._vptr_error_handler = (_func_int **)ppeVar2;
  std::__cxx11::string::_M_construct((ulong)&local_b8,cVar15);
  std::__detail::__to_chars_10_impl<unsigned_long>
            ((char *)local_b8.super_error_handler._vptr_error_handler,
             (uint)local_b8.error_entry_list_.
                   super__Vector_base<(anonymous_namespace)::logical_combination_error_handler::error_entry,_std::allocator<(anonymous_namespace)::logical_combination_error_handler::error_entry>_>
                   ._M_impl.super__Vector_impl_data._M_start,uVar20);
  peVar1 = (pointer)((long)&((local_b8.error_entry_list_.
                              super__Vector_base<(anonymous_namespace)::logical_combination_error_handler::error_entry,_std::allocator<(anonymous_namespace)::logical_combination_error_handler::error_entry>_>
                              ._M_impl.super__Vector_impl_data._M_start)->ptr_).reference_tokens.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + local_d8._M_string_length);
  uVar16 = (pointer)0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar18) {
    uVar16 = local_d8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar16 < peVar1) {
    peVar17 = (pointer)0xf;
    if ((pointer *)local_b8.super_error_handler._vptr_error_handler != ppeVar2) {
      peVar17 = local_b8.error_entry_list_.
                super__Vector_base<(anonymous_namespace)::logical_combination_error_handler::error_entry,_std::allocator<(anonymous_namespace)::logical_combination_error_handler::error_entry>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    }
    if (peVar17 < peVar1) goto LAB_0012054a;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_b8,0,(char *)0x0,(ulong)local_d8._M_dataplus._M_p);
  }
  else {
LAB_0012054a:
    puVar9 = (undefined8 *)
             std::__cxx11::string::_M_append
                       ((char *)&local_d8,(ulong)local_b8.super_error_handler._vptr_error_handler);
  }
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  psVar11 = puVar9 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_100.field_2._M_allocated_capacity = *psVar11;
    local_100.field_2._8_8_ = puVar9[3];
  }
  else {
    local_100.field_2._M_allocated_capacity = *psVar11;
    local_100._M_dataplus._M_p = (pointer)*puVar9;
  }
  local_100._M_string_length = puVar9[1];
  *puVar9 = psVar11;
  puVar9[1] = 0;
  *(undefined1 *)psVar11 = 0;
  (*local_78->_vptr_error_handler[2])(local_78,local_60,local_58,&local_100);
  paVar14 = &local_100.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != paVar14) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  if ((pointer *)local_b8.super_error_handler._vptr_error_handler != ppeVar2) {
    operator_delete(local_b8.super_error_handler._vptr_error_handler,
                    (ulong)((long)&((local_b8.error_entry_list_.
                                     super__Vector_base<(anonymous_namespace)::logical_combination_error_handler::error_entry,_std::allocator<(anonymous_namespace)::logical_combination_error_handler::error_entry>_>
                                     ._M_impl.super__Vector_impl_data._M_finish)->ptr_).
                                   reference_tokens.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar18) {
    operator_delete(local_d8._M_dataplus._M_p,(ulong)(local_d8.field_2._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  std::operator+(&local_d8,"[combination: ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &(anonymous_namespace)::
                  logical_combination<((anonymous_namespace)::logical_combination_types)0>::
                  key_abi_cxx11_);
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_d8);
  psVar11 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_100.field_2._M_allocated_capacity = *psVar11;
    local_100.field_2._8_8_ = plVar8[3];
    local_100._M_dataplus._M_p = (pointer)paVar14;
  }
  else {
    local_100.field_2._M_allocated_capacity = *psVar11;
    local_100._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_100._M_string_length = plVar8[1];
  *plVar8 = (long)psVar11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  logical_combination_error_handler::propagate(&local_50,local_78,&local_100);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != paVar14) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar18) {
    operator_delete(local_d8._M_dataplus._M_p,(ulong)(local_d8.field_2._M_allocated_capacity + 1));
  }
LAB_001206f1:
  peVar1 = local_50.error_entry_list_.
           super__Vector_base<(anonymous_namespace)::logical_combination_error_handler::error_entry,_std::allocator<(anonymous_namespace)::logical_combination_error_handler::error_entry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_50.super_error_handler._vptr_error_handler =
       (_func_int **)&PTR__logical_combination_error_handler_001567b8;
  if (local_50.error_entry_list_.
      super__Vector_base<(anonymous_namespace)::logical_combination_error_handler::error_entry,_std::allocator<(anonymous_namespace)::logical_combination_error_handler::error_entry>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_50.error_entry_list_.
      super__Vector_base<(anonymous_namespace)::logical_combination_error_handler::error_entry,_std::allocator<(anonymous_namespace)::logical_combination_error_handler::error_entry>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    paVar18 = &((local_50.error_entry_list_.
                 super__Vector_base<(anonymous_namespace)::logical_combination_error_handler::error_entry,_std::allocator<(anonymous_namespace)::logical_combination_error_handler::error_entry>_>
                 ._M_impl.super__Vector_impl_data._M_start)->message_).field_2;
    do {
      plVar8 = (long *)(((string *)(paVar18 + -1))->_M_dataplus)._M_p;
      if (paVar18 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)plVar8) {
        operator_delete(plVar8,paVar18->_M_allocated_capacity + 1);
      }
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     *)(paVar18 + -2));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)paVar18 + -0x38));
      peVar17 = (pointer)(paVar18 + 1);
      paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)((long)paVar18 + 0x48);
    } while (peVar17 != peVar1);
  }
  if (local_50.error_entry_list_.
      super__Vector_base<(anonymous_namespace)::logical_combination_error_handler::error_entry,_std::allocator<(anonymous_namespace)::logical_combination_error_handler::error_entry>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.error_entry_list_.
                    super__Vector_base<(anonymous_namespace)::logical_combination_error_handler::error_entry,_std::allocator<(anonymous_namespace)::logical_combination_error_handler::error_entry>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_50.error_entry_list_.
                          super__Vector_base<(anonymous_namespace)::logical_combination_error_handler::error_entry,_std::allocator<(anonymous_namespace)::logical_combination_error_handler::error_entry>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.error_entry_list_.
                          super__Vector_base<(anonymous_namespace)::logical_combination_error_handler::error_entry,_std::allocator<(anonymous_namespace)::logical_combination_error_handler::error_entry>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void validate(const json::json_pointer &ptr, const json &instance, json_patch &patch, error_handler &e) const final
	{
		size_t count = 0;
		logical_combination_error_handler error_summary;

		for (std::size_t index = 0; index < subschemata_.size(); ++index) {
			const std::shared_ptr<schema> &s = subschemata_[index];
			logical_combination_error_handler esub;
			auto oldPatchSize = patch.get_json().size();
			s->validate(ptr, instance, patch, esub);
			if (!esub)
				count++;
			else {
				patch.get_json().get_ref<nlohmann::json::array_t &>().resize(oldPatchSize);
				esub.propagate(error_summary, "case#" + std::to_string(index) + "] ");
			}

			if (is_validate_complete(instance, ptr, e, esub, count, index))
				return;
		}

		if (count == 0) {
			e.error(ptr, instance, "no subschema has succeeded, but one of them is required to validate. Type: " + key + ", number of failed subschemas: " + std::to_string(subschemata_.size()));
			error_summary.propagate(e, "[combination: " + key + " / ");
		}
	}